

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareDriver2_helper.h
# Opt level: O2

void irr::memset32(void *dest,u32 value,size_t bytesize)

{
  ulong uVar1;
  u32 *d;
  bool bVar2;
  
  uVar1 = bytesize >> 5;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    *(u32 *)dest = value;
    *(u32 *)((long)dest + 4) = value;
    *(u32 *)((long)dest + 8) = value;
    *(u32 *)((long)dest + 0xc) = value;
    *(u32 *)((long)dest + 0x10) = value;
    *(u32 *)((long)dest + 0x14) = value;
    *(u32 *)((long)dest + 0x18) = value;
    *(u32 *)((long)dest + 0x1c) = value;
    dest = (void *)((long)dest + 0x20);
  }
  for (uVar1 = 0; ((uint)(bytesize >> 2) & 7) != uVar1; uVar1 = uVar1 + 1) {
    *(u32 *)((long)dest + uVar1 * 4) = value;
  }
  return;
}

Assistant:

inline void memset32(void *dest, const u32 value, size_t bytesize)
{
	u32 *d = (u32 *)dest;

	size_t i;

	// loops unrolled to reduce the number of increments by factor ~8.
	i = bytesize >> (2 + 3);
	while (i) {
		d[0] = value;
		d[1] = value;
		d[2] = value;
		d[3] = value;

		d[4] = value;
		d[5] = value;
		d[6] = value;
		d[7] = value;

		d += 8;
		i -= 1;
	}

	i = (bytesize >> 2) & 7;
	while (i) {
		d[0] = value;
		d += 1;
		i -= 1;
	}
}